

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joint.cpp
# Opt level: O2

void __thiscall
Joint::Joint(Joint *this,double j1,double j2,double j3,double j4,double j5,double j6)

{
  this->j1 = j1;
  this->j2 = j2;
  this->j3 = j3;
  this->j4 = j4;
  this->j5 = j5;
  this->j6 = j6;
  return;
}

Assistant:

Joint::Joint(double j1, double j2, double j3, double j4, double j5, double j6){
      this->j1 = j1;
      this->j2 = j2;
      this->j3 = j3;
      this->j4 = j4;
      this->j5 = j5;
      this->j6 = j6;
}